

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O2

size_type __thiscall
std::experimental::detail::
dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,3ul>
::operator()(dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,3ul>
             *this,dimensions<18446744073709551615UL,_5UL,_18446744073709551615UL> d0)

{
  size_type sVar1;
  dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,2ul,3ul>
  local_1;
  
  sVar1 = dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,2ul,3ul>
          ::operator()(&local_1,d0);
  return sVar1 * 5;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
        ) const noexcept
    {
        static_assert(
            std::rank<dimensions<Dims0...> >::value == Size 
          , "Size not equal to rank of argument"
        );
        return Reduction()(
            Op()(d0[Idx])
          , dims_unary_reduction<Op, Reduction, Sentinel, Idx + 1, Size>()
                (std::move(d0))
        );
    }